

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void generateGrams(vw *all,example **ex)

{
  byte bVar1;
  v_array<unsigned_char> *this;
  byte *pbVar2;
  uchar **ppuVar3;
  undefined8 *in_RSI;
  long in_RDI;
  size_t n;
  size_t length;
  namespace_index index;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  v_array<unsigned_long> *in_stack_000000e8;
  size_t in_stack_000000f0;
  features *in_stack_000000f8;
  size_t in_stack_00000100;
  size_t in_stack_00000108;
  vw *in_stack_00000110;
  size_t in_stack_00000120;
  unsigned_long *in_stack_ffffffffffffffa8;
  v_array<unsigned_long> *in_stack_ffffffffffffffb0;
  ulong local_40;
  byte *local_20;
  
  this = (v_array<unsigned_char> *)*in_RSI;
  ppuVar3 = v_array<unsigned_char>::begin(this);
  local_20 = *ppuVar3;
  ppuVar3 = v_array<unsigned_char>::end(this);
  pbVar2 = *ppuVar3;
  for (; local_20 != pbVar2; local_20 = local_20 + 1) {
    bVar1 = *local_20;
    features::size((features *)0x26a837);
    for (local_40 = 1; local_40 < *(uint *)(in_RDI + 0x6e8 + (ulong)bVar1 * 4);
        local_40 = local_40 + 1) {
      v_array<unsigned_long>::clear(in_stack_ffffffffffffffb0);
      v_array<unsigned_long>::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffa8 = (unsigned_long *)0x0;
      addgrams(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f0,in_stack_000000e8,in_stack_00000120);
    }
  }
  return;
}

Assistant:

void generateGrams(vw& all, example*& ex)
{
  for (namespace_index index : ex->indices)
  {
    size_t length = ex->feature_space[index].size();
    for (size_t n = 1; n < all.ngram[index]; n++)
    {
      all.p->gram_mask.clear();
      all.p->gram_mask.push_back((size_t)0);
      addgrams(all, n, all.skips[index], ex->feature_space[index], length, all.p->gram_mask, 0);
    }
  }
}